

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O0

int Rpo_CheckORGroup(Literal_t *lit1,Literal_t *lit2,int nVars)

{
  int iVar1;
  uint *pOut;
  uint *pOut_00;
  int local_34;
  int isZero;
  uint *and2;
  uint *and1;
  int nVars_local;
  Literal_t *lit2_local;
  Literal_t *lit1_local;
  
  iVar1 = Kit_TruthWordNum(nVars);
  pOut = (uint *)malloc((long)iVar1 << 2);
  iVar1 = Kit_TruthWordNum(nVars);
  pOut_00 = (uint *)malloc((long)iVar1 << 2);
  Kit_TruthAnd(pOut,lit1->transition,lit2->function,nVars);
  local_34 = Kit_TruthIsConst0(pOut,nVars);
  if (local_34 != 0) {
    Kit_TruthAnd(pOut_00,lit2->transition,lit1->function,nVars);
    local_34 = Kit_TruthIsConst0(pOut_00,nVars);
  }
  if (pOut != (uint *)0x0) {
    free(pOut);
  }
  if (pOut_00 != (uint *)0x0) {
    free(pOut_00);
  }
  return local_34;
}

Assistant:

int Rpo_CheckORGroup(Literal_t* lit1, Literal_t* lit2, int nVars) {
    unsigned* and1 = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
    unsigned* and2 = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
    int isZero;
    Kit_TruthAnd(and1, lit1->transition, lit2->function, nVars);
    isZero = Kit_TruthIsConst0(and1, nVars);
    if (isZero) {
        Kit_TruthAnd(and2, lit2->transition, lit1->function, nVars);
        isZero = Kit_TruthIsConst0(and2, nVars);
    }
    ABC_FREE(and1);
    ABC_FREE(and2);
    return isZero;
}